

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float2 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type *psVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  size_type sVar6;
  size_type sVar7;
  string *this;
  string sVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  long *plVar12;
  undefined8 *puVar13;
  long *plVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  Property *prop;
  size_type __n;
  storage_union *extraout_RDX;
  storage_union *var;
  storage_union *extraout_RDX_00;
  storage_union *extraout_RDX_01;
  storage_union *extraout_RDX_02;
  storage_union *extraout_RDX_03;
  storage_union *extraout_RDX_04;
  _Base_ptr __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  pointer pcVar18;
  _Alloc_hider _Var19;
  Property *prop_00;
  bool bVar20;
  ParseResult ret;
  ParseResult sret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> tok_attr;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9e8;
  bool local_609;
  undefined1 local_600 [8];
  _Alloc_hider local_5f8;
  undefined1 local_5f0 [8];
  undefined1 auStack_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [24];
  string local_5b0;
  AttrMetas *local_590;
  Attribute *local_588;
  UsdPrimvarReader_float2 *local_580;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_578;
  _Base_ptr local_570;
  long *local_568 [2];
  long local_558 [2];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  storage_union *local_4f8;
  undefined8 local_4f0;
  storage_union local_4e8;
  optional<tinyusdz::Animatable<std::array<float,2ul>>> *local_4d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4d0;
  string *local_4c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4c0;
  string *local_4b8;
  _Base_ptr local_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [96];
  ios_base local_438 [264];
  string local_330 [16];
  long local_320 [2];
  string local_310 [16];
  undefined8 local_300 [2];
  undefined1 local_2f0 [32];
  key_type local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [40];
  undefined1 auStack_268 [40];
  ios_base aiStack_240 [16];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  bool local_218;
  storage_t<tinyusdz::Token> local_210;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [2];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined4 local_e8 [2];
  undefined1 local_e0 [56];
  undefined1 local_a8 [16];
  undefined1 auStack_98 [24];
  undefined1 local_80 [32];
  storage_t<tinyusdz::Token> local_60;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_548._M_t._M_impl.super__Rb_tree_header._M_header;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_548._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop_00 = (Property *)warn;
  local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_548,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT17(local_2a0._M_local_buf[7],
                             CONCAT16(local_2a0._M_local_buf[6],
                                      CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                               CONCAT22(local_2a0._M_allocated_capacity._2_2_,
                                                        local_2a0._M_allocated_capacity._0_2_)))) +
                    1);
  }
  p_Var17 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4b0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_609 = p_Var17 == local_4b0;
  if (!local_609) {
    local_578 = &preader->varname;
    local_590 = &(preader->fallback)._metas;
    local_4c0 = &(preader->fallback)._paths;
    local_4d8 = (optional<tinyusdz::Animatable<std::array<float,2ul>>> *)
                &(preader->fallback)._attrib;
    local_4b8 = (string *)&preader->result;
    local_4d0 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_580 = preader;
    local_4c8 = warn;
    do {
      local_570 = p_Var17 + 1;
      iVar10 = ::std::__cxx11::string::compare((char *)local_570);
      if (iVar10 == 0) {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"inputs:varname","");
        cVar15 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_548,&local_2d0);
        bVar9 = (_Rb_tree_header *)cVar15._M_node == &local_548._M_t._M_impl.super__Rb_tree_header;
      }
      else {
        bVar9 = false;
      }
      if ((iVar10 == 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2)) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
        local_2b0._8_8_ = ((ulong)local_2b0._8_8_ >> 8 & 0xffffff) << 8;
        local_2a0._M_allocated_capacity._0_2_ = 0;
        local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
        local_220 = (storage_t<double>)0x0;
        local_218 = false;
        local_110[0x10] = false;
        local_110._17_3_ = 0;
        local_110._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_110[0x18] = false;
        local_110._25_3_ = 0;
        local_110._28_4_ = (storage_t<unsigned_int>)0x0;
        local_110._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_110._8_8_ = 0;
        local_e8[0] = _S_red;
        local_e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_268[8] = 0;
        local_290._32_8_ = 0;
        auStack_268._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_290._16_8_ = 0;
        local_290._24_8_ = 0;
        local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_290._8_8_ = (pointer)0x0;
        local_228 = false;
        aiStack_240._8_8_ = (_Base_ptr)0x0;
        aiStack_230 = (ios_base  [8])0x0;
        auStack_268._32_8_ = 0;
        aiStack_240._0_8_ = 0;
        auStack_268._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_268._24_8_ = 0;
        local_1f0[0] = false;
        local_210._16_4_ = ResetToExplicit;
        local_210._20_4_ = EmptyAttrib;
        local_210._24_8_ = 0;
        local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_210._8_8_ = (pointer)0x0;
        aaStack_1e0[1]._8_1_ = false;
        aaStack_1e0[0]._8_8_ = 0;
        aaStack_1e0[1]._0_8_ = (pointer)0x0;
        local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        aaStack_1e0[0]._M_allocated_capacity = 0;
        local_1a0[0] = '\0';
        local_1c0._16_8_ = (pointer)0x0;
        local_1c0._24_8_ = 0;
        local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_170[8] = false;
        aStack_180._8_8_ = 0;
        auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_1a0._24_8_ = 0;
        aStack_180._M_allocated_capacity = 0;
        local_1a0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_1a0._16_8_ = (pointer)0x0;
        auStack_148[8] = '\0';
        auStack_170._32_8_ = (pointer)0x0;
        auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_170._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_170._24_8_ = 0;
        local_138[0x20] = false;
        local_138._16_8_ = 0;
        local_138._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_138[8] = false;
        local_138._9_3_ = 0;
        local_138._12_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_e0._8_8_ = local_e8;
        local_a8[0] = 0;
        local_e0._40_8_ = 0;
        local_e0._48_8_ = (pointer)0x0;
        local_e0._24_8_ = 0;
        local_e0._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_98[8] = 0;
        auStack_98._9_8_ = 0;
        local_a8._8_8_ = 0;
        auStack_98[0] = 0;
        auStack_98._1_7_ = 0;
        uStack_40 = false;
        uStack_3f = 0;
        local_60._16_8_ = 0;
        local_60._24_1_ = 0;
        local_60._25_7_ = 0;
        local_60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_60._8_8_ = 0;
        local_80._16_8_ = (storage_t<double>)0x0;
        local_80._24_8_ = 0;
        local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_80._8_8_ = 0;
        local_2f0._0_8_ = (long)local_2f0 + 0x10;
        local_e0._16_8_ = local_e0._8_8_;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f0,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        prop = (Property *)(p_Var17 + 2);
        local_4a8._0_8_ = local_498;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"inputs:varname","");
        prop_00 = (Property *)local_4a8;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                  ((ParseResult *)local_600,&local_548,(string *)local_2f0,prop,(string *)prop_00,
                   (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
        if ((undefined1 *)local_4a8._0_8_ != local_498) {
          operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
        }
        if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        if (local_600._0_4_ == TypeMismatch) {
          local_310._0_8_ = local_300;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_310,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          prop_00 = (Property *)local_4a8;
          local_4a8._0_8_ = local_498;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","");
          (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                    ((ParseResult *)local_5d8,(_anonymous_namespace_ *)&local_548,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_310,(string *)prop,prop_00,(string *)local_578,
                     in_stack_fffffffffffff9e8);
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          paVar4 = &local_5b0.field_2;
          if ((undefined8 *)local_310._0_8_ != local_300) {
            operator_delete((void *)local_310._0_8_,local_300[0] + 1);
          }
          if (local_5d8._0_4_ == Success) {
            iVar10 = 3;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x1098);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            local_568[0] = local_558;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_568,"Faied to parse inputs:varname: {}","");
            fmt::format<std::__cxx11::string>
                      (&local_5b0,(fmt *)local_568,(string *)(local_5d8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4a8,local_5b0._M_dataplus._M_p,
                                 local_5b0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._M_dataplus._M_p != paVar4) {
              operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_568[0] != local_558) {
              operator_delete(local_568[0],local_558[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar12 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)local_568,(ulong)(err->_M_dataplus)._M_p);
              psVar2 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar2) {
                local_5b0.field_2._M_allocated_capacity = *psVar2;
                local_5b0.field_2._8_8_ = plVar12[3];
                local_5b0._M_dataplus._M_p = (pointer)paVar4;
              }
              else {
                local_5b0.field_2._M_allocated_capacity = *psVar2;
                local_5b0._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_5b0._M_string_length = plVar12[1];
              *plVar12 = (long)psVar2;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_5b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5b0._M_dataplus._M_p != paVar4) {
                operator_delete(local_5b0._M_dataplus._M_p,
                                local_5b0.field_2._M_allocated_capacity + 1);
              }
              if (local_568[0] != local_558) {
                operator_delete(local_568[0],local_558[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
            ::std::ios_base::~ios_base(local_438);
            iVar10 = 1;
          }
          if ((undefined1 *)local_5d8._8_8_ != local_5c8 + 8) {
            operator_delete((void *)local_5d8._8_8_,local_5c8._8_8_ + 1);
          }
        }
        else {
          iVar10 = 0;
          if (local_600._0_4_ == Success) {
            bVar9 = ConvertTokenAttributeToStringAttribute
                              ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                               local_578);
            iVar10 = 3;
            if (!bVar9) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x1086);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,
                         "Failed to convert inputs:varname token type to string type.",0x3b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar12 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_5b0,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar12 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 ==
                    pbVar1) {
                  local_5c8._0_8_ = (pbVar1->_M_dataplus)._M_p;
                  local_5c8._8_8_ = plVar12[3];
                  local_5d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5c8;
                }
                else {
                  local_5c8._0_8_ = (pbVar1->_M_dataplus)._M_p;
                  local_5d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12
                  ;
                }
                local_5d8._8_8_ = plVar12[1];
                *plVar12 = (long)pbVar1;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_5d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
                {
                  operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
                  operator_delete(local_5b0._M_dataplus._M_p,
                                  local_5b0.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              ::std::ios_base::~ios_base(local_438);
              iVar10 = 1;
            }
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5e8) {
          operator_delete(local_5f8._M_p,(ulong)(auStack_5e8._0_8_ + 1));
        }
        if (auStack_98[0x10] == '\x01') {
          nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
          destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
        }
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_a8 + 8));
        AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
        if (iVar10 == 0) goto LAB_0023e4fd;
      }
      else {
LAB_0023e4fd:
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        in = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)in,"inputs:fallback","");
        sVar7 = local_518._M_string_length;
        sVar6 = local_5b0._M_string_length;
        local_5f8._M_p = auStack_5e8;
        local_5f0 = (undefined1  [8])0x0;
        auStack_5e8._0_8_ = auStack_5e8._0_8_ & 0xffffffffffffff00;
        __n = local_518._M_string_length;
        if (local_5b0._M_string_length < local_518._M_string_length) {
          __n = local_5b0._M_string_length;
        }
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar10 = bcmp(local_518._M_dataplus._M_p,local_5b0._M_dataplus._M_p,__n);
          bVar9 = iVar10 == 0;
        }
        local_588 = (Attribute *)(p_Var17 + 2);
        if ((bool)(bVar9 ^ 1U | sVar7 != sVar6)) {
          local_600._0_4_ = 1;
        }
        else {
          if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_600._0_4_ = 7;
            local_4a8._0_8_ = local_498;
            local_5d8._0_8_ = &DAT_0000003e;
            local_4a8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4a8,(ulong)local_5d8)
            ;
            local_498._0_8_ = local_5d8._0_8_;
            builtin_strncpy((char *)local_4a8._0_8_,
                            "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
            local_4a8._8_8_ = local_5d8._0_8_;
            *(char *)(local_4a8._0_8_ + local_5d8._0_8_) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)local_2b0,(fmt *)local_4a8,(string *)in,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d8._0_8_);
            ::std::__cxx11::string::operator=((string *)&local_5f8,(string *)local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._0_8_ != &local_2a0) {
              operator_delete((void *)local_2b0._0_8_,
                              CONCAT17(local_2a0._M_local_buf[7],
                                       CONCAT16(local_2a0._M_local_buf[6],
                                                CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                         CONCAT22(local_2a0._M_allocated_capacity.
                                                                  _2_2_,local_2a0.
                                                                        _M_allocated_capacity._0_2_)
                                                        ))) + 1);
            }
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
          }
          if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4c0,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var17[6]._M_parent);
            local_600 = (undefined1  [8])((ulong)local_600 & 0xffffffff00000000);
          }
          Attribute::type_name_abi_cxx11_((string *)local_5d8,local_588);
          local_2b0._0_8_ = &local_2a0;
          local_2a0._M_allocated_capacity._4_2_ = 0x3274;
          local_2a0._M_allocated_capacity._0_2_ = 0x6c66;
          local_2a0._M_allocated_capacity._2_2_ = 0x616f;
          local_2b0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6
          ;
          local_2a0._M_local_buf[6] = '\0';
          if ((pointer)local_5d8._8_8_ == (pointer)0x6) {
            var = (storage_union *)(ulong)(*(uint *)local_5d8._0_8_ ^ 0x616f6c66);
            bVar9 = *(short *)(local_5d8._0_8_ + 4) == 0x3274 &&
                    (*(uint *)local_5d8._0_8_ ^ 0x616f6c66) == 0;
          }
          else {
            bVar9 = false;
            var = extraout_RDX;
          }
          bVar20 = true;
          if (!bVar9) {
            local_4f8 = &local_4e8;
            local_4e8._4_2_ = 0x3274;
            local_4e8._0_4_ = 0x616f6c66;
            local_4f0 = 6;
            local_4e8._6_1_ = 0;
            if ((pointer)local_5d8._8_8_ == (pointer)0x6) {
              bVar20 = *(short *)(local_5d8._0_8_ + 4) == 0x3274 &&
                       (*(uint *)local_5d8._0_8_ ^ 0x616f6c66) == 0;
              var = (storage_union *)(ulong)(*(uint *)local_5d8._0_8_ ^ 0x616f6c66);
            }
            else {
              bVar20 = false;
              var = local_4f8;
            }
          }
          if ((!bVar9) && (local_4f8 != &local_4e8)) {
            operator_delete(local_4f8,
                            CONCAT17(local_4e8._7_1_,
                                     CONCAT16(local_4e8._6_1_,
                                              CONCAT24(local_4e8._4_2_,local_4e8._0_4_))) + 1);
            var = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0._M_local_buf[7],
                                     CONCAT16(local_2a0._M_local_buf[6],
                                              CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                       CONCAT22(local_2a0._M_allocated_capacity.
                                                                _2_2_,local_2a0.
                                                                      _M_allocated_capacity._0_2_)))
                                    ) + 1);
            var = extraout_RDX_01;
          }
          if (bVar20) {
            iVar10 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
            if (iVar10 != 1) {
              if (iVar10 == 0) {
                (local_580->fallback)._value_empty = true;
                AttrMetas::operator=(local_590,(AttrMetas *)(p_Var17 + 7));
LAB_0023ebfb:
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_548,in);
                local_600 = (undefined1  [8])((ulong)local_600 & 0xffffffff00000000);
              }
              else {
                prop_00 = (Property *)0x25;
                ::std::__cxx11::string::_M_replace((ulong)&local_5f8,0,(char *)local_5f0,0x400008);
                local_600._0_4_ = 8;
              }
              goto LAB_0023ec08;
            }
            if (p_Var17[5]._M_left == p_Var17[5]._M_parent) {
              if (p_Var17[4]._M_right == (_Base_ptr)0x0) {
                bVar9 = false;
              }
              else {
                iVar10 = (**(code **)p_Var17[4]._M_right)();
                bVar9 = iVar10 == 4;
                var = extraout_RDX_02;
              }
              if ((bVar9) || ((p_Var17[5]._M_color & _S_black) != _S_red)) {
                (local_580->fallback)._blocked = true;
              }
            }
            if (((char)p_Var17[5]._M_color == _S_red) &&
               ((((p_Var17[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar10 = (**(code **)p_Var17[4]._M_right)(), var = extraout_RDX_03, iVar10 == 0))
                 || ((p_Var17[4]._M_right != (_Base_ptr)0x0 &&
                     (iVar10 = (**(code **)p_Var17[4]._M_right)(), var = extraout_RDX_04,
                     iVar10 == 1)))) && (p_Var17[5]._M_left == p_Var17[5]._M_parent)))) {
              bVar9 = true;
              bVar20 = false;
            }
            else {
              (anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
                        ((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_4a8,
                         (_anonymous_namespace_ *)&p_Var17[4]._M_parent,(PrimVar *)var);
              sVar8 = local_4a8[0];
              local_2b0[0] = local_4a8[0];
              if (local_4a8[0] == (string)0x1) {
                local_2a0._M_allocated_capacity._0_2_ = local_498._0_2_;
                local_2b0._8_8_ = local_4a8._8_8_;
                local_2a0._8_8_ = local_498._8_8_;
                local_290._0_8_ = local_498._16_8_;
                local_290._8_8_ = local_498._24_8_;
                local_498._8_8_ = (void *)0x0;
                local_498._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_498._24_8_ = (pointer)0x0;
                local_290[0x10] = local_498[0x20];
                nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,2ul>>>::
                operator=(local_4d8,(Animatable<std::array<float,_2UL>_> *)(local_2b0 + 8));
              }
              else {
                local_600._0_4_ = 8;
                prop_00 = (Property *)0x55;
                ::std::__cxx11::string::_M_replace((ulong)&local_5f8,0,(char *)local_5f0,0x4002d6);
              }
              if ((local_2b0[0] == '\x01') && ((void *)local_2a0._8_8_ != (void *)0x0)) {
                operator_delete((void *)local_2a0._8_8_,local_290._8_8_ - local_2a0._8_8_);
              }
              if (sVar8 != (string)0x0) {
                AttrMetas::operator=(local_590,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_548,in);
                local_600 = (undefined1  [8])((ulong)local_600 & 0xffffffff00000000);
              }
              bVar20 = true;
              bVar9 = false;
            }
            if (bVar9) {
              if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
                AttrMetas::operator=(local_590,(AttrMetas *)(p_Var17 + 7));
                in = &local_518;
                goto LAB_0023ebfb;
              }
              goto LAB_0023ec08;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8) {
              operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
            }
            if ((bVar20) ||
               (pcVar18 = (pointer)auStack_5e8._0_8_, _Var19._M_p = local_5f8._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._M_p
               == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5e8))
            goto LAB_0023ec1f;
          }
          else {
            local_600._0_4_ = 3;
            ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0._M_local_buf,local_5b0._M_dataplus._M_p,
                                 local_5b0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," expects type `",0xf);
            local_4a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x6;
            local_498._0_7_ = 0x3274616f6c66;
            local_4a8._0_8_ = local_498;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_498,6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"` but defined as type `",0x17);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_5d8._0_8_,local_5d8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"`",1);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&local_5f8,(string *)local_4a8);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_230);
LAB_0023ec08:
            pcVar18 = (pointer)local_5c8._0_8_;
            _Var19._M_p = (pointer)local_5d8._0_8_;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
            goto LAB_0023ec1f;
          }
          operator_delete(_Var19._M_p,(ulong)(pcVar18 + 1));
        }
LAB_0023ec1f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if (((ulong)local_600 & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0023eead:
          bVar9 = false;
        }
        else {
          bVar9 = true;
          if (local_600._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x109e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            local_5d8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5d8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[16],std::__cxx11::string>
                      ((string *)local_4a8,(fmt *)local_5d8,(string *)"inputs:fallback",
                       (char (*) [16])&local_5f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00)
            ;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_4a8._0_8_,local_4a8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8) {
              operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar13 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)local_5d8,(ulong)(err->_M_dataplus)._M_p);
              pcVar3 = (char *)(puVar13 + 2);
              if ((char *)*puVar13 == pcVar3) {
                local_498._0_8_ = *(undefined8 *)pcVar3;
                local_498._8_8_ = puVar13[3];
                local_4a8._0_8_ = local_498;
              }
              else {
                local_498._0_8_ = *(undefined8 *)pcVar3;
                local_4a8._0_8_ = (char *)*puVar13;
              }
              local_4a8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar13 + 1);
              *puVar13 = pcVar3;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
              if ((undefined1 *)local_4a8._0_8_ != local_498) {
                operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_5d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8) {
                operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
            iVar10 = 1;
            goto LAB_0023eead;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5e8) {
          operator_delete(local_5f8._M_p,(ulong)(auStack_5e8._0_8_ + 1));
        }
        if (bVar9) {
          local_330._0_8_ = local_320;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_330,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          prop_00 = (Property *)local_2b0;
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"outputs:result","");
          (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                    ((ParseResult *)local_4a8,(_anonymous_namespace_ *)&local_548,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_330,&local_588->_name,prop_00,local_4b8,
                     (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffff9e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0._M_local_buf[7],
                                     CONCAT16(local_2a0._M_local_buf[6],
                                              CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                       CONCAT22(local_2a0._M_allocated_capacity.
                                                                _2_2_,local_2a0.
                                                                      _M_allocated_capacity._0_2_)))
                                    ) + 1);
          }
          if ((long *)local_330._0_8_ != local_320) {
            operator_delete((void *)local_330._0_8_,local_320[0] + 1);
          }
          iVar10 = 0;
          if ((local_4a8._0_8_ & 0xfffffffd) == 0) {
            iVar10 = 3;
LAB_0023f20c:
            bVar9 = false;
          }
          else {
            bVar9 = true;
            if (local_4a8._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x10a0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              local_5d8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5d8,"Parsing shader output property `{}` failed. Error: {}"
                         ,"");
              fmt::format<char[15],std::__cxx11::string>
                        ((string *)local_600,(fmt *)local_5d8,(string *)"outputs:result",
                         (char (*) [15])(local_4a8 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         prop_00);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b0,(char *)local_600,(long)local_5f8._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if (local_600 != (undefined1  [8])local_5f0) {
                operator_delete((void *)local_600,(ulong)((long)local_5f0 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_5d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8) {
                operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar14 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_5d8,(ulong)(err->_M_dataplus)._M_p);
                plVar12 = plVar14 + 2;
                if ((long *)*plVar14 == plVar12) {
                  local_5f0 = (undefined1  [8])*plVar12;
                  auStack_5e8._0_8_ = plVar14[3];
                  local_600 = (undefined1  [8])local_5f0;
                }
                else {
                  local_5f0 = (undefined1  [8])*plVar12;
                  local_600 = (undefined1  [8])*plVar14;
                }
                local_5f8._M_p = (pointer)plVar14[1];
                *plVar14 = (long)plVar12;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_600);
                if (local_600 != (undefined1  [8])local_5f0) {
                  operator_delete((void *)local_600,(ulong)((long)local_5f0 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_5d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
                {
                  operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(aiStack_240);
              iVar10 = 1;
              goto LAB_0023f20c;
            }
          }
          if (local_4a8._8_8_ != (long)local_498 + 8) {
            operator_delete((void *)local_4a8._8_8_,local_498._8_8_ + 1);
          }
          __k = local_570;
          if (bVar9) {
            cVar15 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_548,(key_type *)local_570);
            p_Var5 = &local_548._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar15._M_node == p_Var5) {
              pmVar16 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](local_4d0,(key_type *)__k);
              ::std::__cxx11::string::_M_assign((string *)pmVar16);
              (pmVar16->_attrib)._varying_authored = (bool)p_Var17[3].field_0x4;
              (pmVar16->_attrib)._variability = p_Var17[3]._M_color;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar16->_attrib)._var,(any *)&p_Var17[4]._M_parent);
              (pmVar16->_attrib)._var._blocked = SUB41(p_Var17[5]._M_color,0);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=(&(pmVar16->_attrib)._var._ts._samples,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&p_Var17[5]._M_parent);
              (pmVar16->_attrib)._var._ts._dirty = SUB41(p_Var17[6]._M_color,0);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pmVar16->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var17[6]._M_parent);
              AttrMetas::operator=(&(pmVar16->_attrib)._metas,(AttrMetas *)(p_Var17 + 7));
              *(_Base_ptr *)&pmVar16->_listOpQual = p_Var17[0x17]._M_parent;
              (pmVar16->_rel).type = *(Type *)&p_Var17[0x17]._M_left;
              Path::operator=(&(pmVar16->_rel).targetPath,(Path *)&p_Var17[0x17]._M_right);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pmVar16->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var17[0x1e]._M_parent);
              (pmVar16->_rel).listOpQual = p_Var17[0x1f]._M_color;
              AttrMetas::operator=(&(pmVar16->_rel)._metas,(AttrMetas *)&p_Var17[0x1f]._M_parent);
              (pmVar16->_rel)._varying_authored = *(bool *)&p_Var17[0x2f]._M_left;
              ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
              __k = local_570;
              pmVar16->_has_custom = *(bool *)&p_Var17[0x30]._M_right;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_570);
            }
            cVar15 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_548,(key_type *)__k);
            iVar10 = 0;
            if ((_Rb_tree_header *)cVar15._M_node == p_Var5) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x10a2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4a8,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b0,(char *)local_4a8._0_8_,local_4a8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if ((undefined1 *)local_4a8._0_8_ != local_498) {
                operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
              }
              this = local_4c8;
              if (local_4c8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar13 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_600,(ulong)(err->_M_dataplus)._M_p);
                pcVar3 = (char *)(puVar13 + 2);
                if ((char *)*puVar13 == pcVar3) {
                  local_498._0_8_ = *(undefined8 *)pcVar3;
                  local_498._8_8_ = puVar13[3];
                  local_4a8._0_8_ = local_498;
                }
                else {
                  local_498._0_8_ = *(undefined8 *)pcVar3;
                  local_4a8._0_8_ = (char *)*puVar13;
                }
                local_4a8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar13 + 1);
                *puVar13 = pcVar3;
                puVar13[1] = 0;
                *(undefined1 *)(puVar13 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)this,(string *)local_4a8);
                if ((undefined1 *)local_4a8._0_8_ != local_498) {
                  operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
                }
                if (local_600 != (undefined1  [8])local_5f0) {
                  operator_delete((void *)local_600,(ulong)((long)local_5f0 + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
              ::std::ios_base::~ios_base(aiStack_240);
            }
          }
        }
      }
      if ((iVar10 != 3) && (iVar10 != 0)) break;
      p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
      local_609 = p_Var17 == local_4b0;
    } while (!local_609);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_548,
             (_Link_type)local_548._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_609;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float2>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float2 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("Primreader_float2 prop = " << prop.first);
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float2,
                   preader->fallback)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float2, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}